

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O0

void monster_groups_verify(chunk *c)

{
  monster_conflict *pmVar1;
  monster_group_info *info;
  monster *mon;
  mon_group_list_entry_conflict *entry;
  monster_group_conflict *group;
  wchar_t i;
  chunk *c_local;
  
  for (group._4_4_ = L'\0'; group._4_4_ < (int)(uint)z_info->level_monster_max;
      group._4_4_ = group._4_4_ + L'\x01') {
    if (c->monster_groups[group._4_4_] != (monster_group *)0x0) {
      for (mon = (monster *)c->monster_groups[group._4_4_]->member_list; mon != (monster *)0x0;
          mon = (monster *)mon->original_race) {
        pmVar1 = cave_monster((chunk_conflict *)c,*(wchar_t *)&mon->race);
        if (pmVar1->group_info[0].index != group._4_4_) {
          if (pmVar1->group_info[1].index == L'\0') {
            quit_fmt("Bad group index: group: %d, monster: %d",(ulong)(uint)group._4_4_,
                     (ulong)(uint)pmVar1->group_info[0].index);
          }
          else {
            if (pmVar1->group_info[1].index != group._4_4_) {
              quit_fmt("Bad group index: group: %d, monster: %d",(ulong)(uint)group._4_4_,
                       (ulong)(uint)pmVar1->group_info[1].index);
            }
            if (pmVar1->group_info[1].role != MON_GROUP_LEADER) {
              quit_fmt("Bad monster role: group: %d, monster: %d",(ulong)(uint)group._4_4_,
                       (ulong)(uint)pmVar1->group_info[1].index);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void monster_groups_verify(struct chunk *c)
{
	int i;

	for (i = 0; i < z_info->level_monster_max; i++) {
		if (c->monster_groups[i]) {
			struct monster_group *group = c->monster_groups[i];
			struct mon_group_list_entry *entry = group->member_list;
			while (entry) {
				struct monster *mon = cave_monster(c, entry->midx);
				struct monster_group_info *info = mon->group_info;
				if (info[PRIMARY_GROUP].index != i) {
					if (info[SUMMON_GROUP].index) {
						if (info[SUMMON_GROUP].index != i) {
							quit_fmt("Bad group index: group: %d, monster: %d",
									 i, info[SUMMON_GROUP].index);
						}
						if (info[SUMMON_GROUP].role != MON_GROUP_LEADER) {
							quit_fmt("Bad monster role: group: %d, monster: %d",
									 i, info[SUMMON_GROUP].index);
						}
					} else {
						quit_fmt("Bad group index: group: %d, monster: %d",
								 i, info[PRIMARY_GROUP].index);
					}
				}
				entry = entry->next;
			}
		}
	}
}